

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_test_connection.c
# Opt level: O1

apx_error_t
apx_clientTestConnection_remote_file_write_notification
          (apx_clientTestConnection_t *self,apx_file_t *file,uint32_t offset,uint8_t *data,
          apx_size_t size)

{
  return 0xb;
}

Assistant:

apx_error_t apx_clientTestConnection_remote_file_write_notification(apx_clientTestConnection_t* self, apx_file_t* file, uint32_t offset, uint8_t const* data, apx_size_t size)
{
   (void)self;
   (void)file;
   (void)offset;
   (void)data;
   (void)size;
   return APX_NOT_IMPLEMENTED_ERROR;
}